

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O0

bool __thiscall FIntermissionActionWiper::ParseKey(FIntermissionActionWiper *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  int v;
  WipeType FT [5];
  FScanner *sc_local;
  FIntermissionActionWiper *this_local;
  
  memcpy(&stack0xffffffffffffff88,&PTR_anon_var_dwarf_ab5a0_009ec880,0x50);
  bVar1 = FScanner::Compare(sc,"WipeType");
  if (bVar1) {
    FScanner::MustGetToken(sc,0x3d);
    FScanner::MustGetToken(sc,0x101);
    iVar2 = FScanner::MatchString(sc,(char **)&stack0xffffffffffffff88,0x10);
    if (iVar2 != -1) {
      this->mWipeType = *(gamestate_t *)&FT[iVar2].Name;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = FIntermissionAction::ParseKey(&this->super_FIntermissionAction,sc);
  }
  return this_local._7_1_;
}

Assistant:

bool FIntermissionActionWiper::ParseKey(FScanner &sc)
{
	struct WipeType
	{
		const char *Name;
		gamestate_t Type;
	}
	const FT[] = {
		{ "Crossfade", GS_FORCEWIPEFADE },
		{ "Melt", GS_FORCEWIPEMELT },
		{ "Burn", GS_FORCEWIPEBURN },
		{ "Default", GS_FORCEWIPE },
		{ NULL, GS_FORCEWIPE }
	};

	if (sc.Compare("WipeType"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_Identifier);
		int v = sc.MatchString(&FT[0].Name, sizeof(FT[0]));
		if (v != -1) mWipeType = FT[v].Type;
		return true;
	}
	else return Super::ParseKey(sc);
}